

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linux-core.c
# Opt level: O0

uint64_t uv__hrtime(uv_clocktype_t type)

{
  int iVar1;
  int in_EDI;
  clock_t clock_id;
  timespec t;
  clockid_t local_28;
  timespec local_20;
  int local_c;
  uint64_t local_8;
  
  local_c = in_EDI;
  if ((in_EDI == 1) && (uv__hrtime::fast_clock_id == -1)) {
    iVar1 = clock_getres(6,&local_20);
    if ((iVar1 == 0) && (local_20.tv_nsec < 0xf4241)) {
      uv__hrtime::fast_clock_id = 6;
    }
    else {
      uv__hrtime::fast_clock_id = 1;
    }
  }
  local_28 = 1;
  if (local_c == 1) {
    local_28 = (clockid_t)uv__hrtime::fast_clock_id;
  }
  iVar1 = clock_gettime(local_28,&local_20);
  if (iVar1 == 0) {
    local_8 = local_20.tv_sec * 1000000000 + local_20.tv_nsec;
  }
  else {
    local_8 = 0;
  }
  return local_8;
}

Assistant:

uint64_t uv__hrtime(uv_clocktype_t type) {
  static clock_t fast_clock_id = -1;
  struct timespec t;
  clock_t clock_id;

  /* Prefer CLOCK_MONOTONIC_COARSE if available but only when it has
   * millisecond granularity or better.  CLOCK_MONOTONIC_COARSE is
   * serviced entirely from the vDSO, whereas CLOCK_MONOTONIC may
   * decide to make a costly system call.
   */
  /* TODO(bnoordhuis) Use CLOCK_MONOTONIC_COARSE for UV_CLOCK_PRECISE
   * when it has microsecond granularity or better (unlikely).
   */
  if (type == UV_CLOCK_FAST && fast_clock_id == -1) {
    if (clock_getres(CLOCK_MONOTONIC_COARSE, &t) == 0 &&
        t.tv_nsec <= 1 * 1000 * 1000) {
      fast_clock_id = CLOCK_MONOTONIC_COARSE;
    } else {
      fast_clock_id = CLOCK_MONOTONIC;
    }
  }

  clock_id = CLOCK_MONOTONIC;
  if (type == UV_CLOCK_FAST)
    clock_id = fast_clock_id;

  if (clock_gettime(clock_id, &t))
    return 0;  /* Not really possible. */

  return t.tv_sec * (uint64_t) 1e9 + t.tv_nsec;
}